

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::processPriorityCommand(CoreBroker *this,ActionMessage *command)

{
  BrokerBase *this_00;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *this_01;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *this_02;
  ushort uVar1;
  GlobalFederateId GVar2;
  action_t aVar3;
  BaseType BVar4;
  BaseType BVar5;
  uint uVar6;
  int iVar7;
  pointer pcVar8;
  size_type sVar9;
  pointer pAVar10;
  pointer pBVar11;
  pointer pBVar12;
  TimeoutMonitor *this_03;
  string_view message;
  string_view message_00;
  string_view message_01;
  bool bVar13;
  ConnectionState CVar14;
  route_id rVar15;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var16;
  BasicBrokerInfo *pBVar17;
  __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
  _Var18;
  pointer pBVar19;
  ActionMessage *in_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  iterator __begin4;
  pointer pAVar20;
  string_view searchValue;
  string_view searchValue_00;
  string_view searchValue1;
  string_view searchValue1_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view fmt;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view existingValue;
  string_view fmt_00;
  string_view existingValue_00;
  format_args args;
  format_args args_00;
  route_id route_1;
  undefined4 uStack_164;
  size_t local_160;
  ActionMessage pngrep;
  string local_50;
  
  this_00 = &this->super_BrokerBase;
  if (0x17 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    GVar2.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    pcVar8 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar9 = (this->super_BrokerBase).identifier._M_string_length;
    prettyPrintString_abi_cxx11_(&local_50,(helics *)command,in_RDX);
    pngrep.dest_id.gid = (command->source_id).gid;
    pngrep._0_8_ = local_50._M_dataplus._M_p;
    pngrep.source_id.gid = (undefined4)local_50._M_string_length;
    pngrep.source_handle.hid = local_50._M_string_length._4_4_;
    fmt.size_ = 0x1d;
    fmt.data_ = (char *)0x1a;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&pngrep;
    ::fmt::v11::vformat_abi_cxx11_((string *)&route_1,(v11 *)"|| priority_cmd:{} from {}",fmt,args);
    in_R9.values_ = (value<fmt::v11::context> *)0x0;
    message._M_str = _route_1;
    message._M_len = local_160;
    name._M_str = pcVar8;
    name._M_len = sVar9;
    BrokerBase::sendToLogger(this_00,GVar2,0x18,name,message,false);
    std::__cxx11::string::~string((string *)&route_1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  aVar3 = command->messageAction;
  if ((1 < (uint)(aVar3 + ~(cmd_reg_broker|cmd_tick))) && (aVar3 != cmd_set_global)) {
    if (aVar3 == cmd_reg_broker) {
      brokerRegistration(this,command);
      return;
    }
    if (aVar3 == cmd_broker_setup) {
      (this->super_BrokerBase).global_broker_id_local.gid =
           (this->super_BrokerBase).global_id._M_i.gid;
      (this->super_BrokerBase).field_0x294 = (this->super_BrokerBase).field_0x293 & 1;
      (((this->super_BrokerBase).timeCoord._M_t.
        super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
        .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->mSourceId).gid =
           (this->super_BrokerBase).global_broker_id_local.gid;
      (this->super_BrokerBase).field_0x295 = 1;
      pAVar20 = (this->earlyMessages).
                super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar10 = (this->earlyMessages).
                super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pAVar20 == pAVar10) {
        return;
      }
      for (; pAVar20 != pAVar10; pAVar20 = pAVar20 + 1) {
        (*(this->super_Broker)._vptr_Broker[(ulong)((uint)pAVar20->messageAction >> 0x1f) + 0x1d])
                  (this,pAVar20);
      }
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
                (&this->earlyMessages);
      return;
    }
    if (aVar3 == cmd_reg_fed) {
      fedRegistration(this,command);
      return;
    }
    if (aVar3 == cmd_send_command) {
      processCommandInstruction(this,command);
      return;
    }
    if (aVar3 != cmd_broker_query) {
      if (aVar3 != cmd_broker_ack) {
        if (aVar3 == cmd_fed_ack) {
          this_01 = &this->mFederates;
          searchValue._M_str = (char *)(command->payload).heap;
          searchValue._M_len = (command->payload).bufferSize;
          _Var16 = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::find(this_01,searchValue);
          if (_Var16._M_current ==
              (this->mFederates).dataStorage.
              super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pngrep._0_8_ = (command->payload).bufferSize;
            pngrep._8_8_ = (command->payload).heap;
            searchValue1._M_str = (char *)pngrep._8_8_;
            searchValue1._M_len = pngrep._0_8_;
            gmlc::containers::
            DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
            ::insert<std::basic_string_view<char,std::char_traits<char>>>
                      ((DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
                        *)this_01,searchValue1,&command->dest_id,
                       (basic_string_view<char,_std::char_traits<char>_> *)&pngrep);
            rVar15 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
            pBVar12 = (this->mFederates).dataStorage.
                      super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pBVar12[-1].route.rid = rVar15.rid;
            pBVar12[-1].global_id.gid = (command->dest_id).gid;
            std::
            _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<helics::GlobalFederateId&,helics::route_id&>
                      ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->routing_table,&(_Var16._M_current)->global_id,&pBVar12[-1].route);
            return;
          }
          uVar6 = ((_Var16._M_current)->route).rid;
          route_1.rid = uVar6;
          iVar7 = ((_Var16._M_current)->global_id).gid;
          if ((iVar7 == -1700000000) || (iVar7 == -2010000000)) {
            ((_Var16._M_current)->global_id).gid = (command->dest_id).gid;
            existingValue._M_str = ((_Var16._M_current)->name)._M_dataplus._M_p;
            existingValue._M_len = ((_Var16._M_current)->name)._M_string_length;
            gmlc::containers::
            DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
            ::addSearchTerm(this_01,&command->dest_id,existingValue);
          }
          (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)uVar6,command);
          std::
          _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<helics::GlobalFederateId&,helics::route_id&>
                    ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->routing_table,&(_Var16._M_current)->global_id,&route_1);
          if ((this->super_BrokerBase).enable_profiling != true) {
            return;
          }
          ActionMessage::ActionMessage
                    (&pngrep,cmd_set_profiler_flag,
                     (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                     (GlobalFederateId)(command->dest_id).gid);
          pngrep.flags._0_1_ = (byte)pngrep.flags | 0x20;
          (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)_route_1 & 0xffffffff,&pngrep);
        }
        else if (aVar3 == cmd_priority_disconnect) {
          pBVar17 = getBrokerById(this,(GlobalBrokerId)(command->source_id).gid);
          if (pBVar17 != (BasicBrokerInfo *)0x0) {
            pBVar17->state = DISCONNECTED;
          }
          CVar14 = getAllConnectionState(this);
          if (CVar14 < DISCONNECTED) {
            return;
          }
          if ((this->super_BrokerBase).field_0x294 == '\0') {
            ActionMessage::ActionMessage(&pngrep,cmd_priority_disconnect);
            pngrep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
            (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&pngrep);
            ActionMessage::~ActionMessage(&pngrep);
          }
          ActionMessage::ActionMessage(&pngrep,cmd_stop);
          BrokerBase::addActionMessage(this_00,&pngrep);
        }
        else {
          if (aVar3 != cmd_ping_priority) {
            return;
          }
          if ((command->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
            routeMessage(this,command);
            return;
          }
          ActionMessage::ActionMessage(&pngrep,cmd_ping_reply);
          pngrep.dest_id.gid = (command->source_id).gid;
          pngrep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          routeMessage(this,&pngrep);
        }
        ActionMessage::~ActionMessage(&pngrep);
        return;
      }
      __x._M_str = (char *)(command->payload).heap;
      __x._M_len = (command->payload).bufferSize;
      __y._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      __y._M_len = (this->super_BrokerBase).identifier._M_string_length;
      bVar13 = std::operator==(__x,__y);
      if (!bVar13) {
        this_02 = &this->mBrokers;
        searchValue_00._M_str = (char *)(command->payload).heap;
        searchValue_00._M_len = (command->payload).bufferSize;
        _Var18 = gmlc::containers::
                 DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                 ::find(this_02,searchValue_00);
        if (_Var18._M_current ==
            (this->mBrokers).dataStorage.
            super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pngrep._0_8_ = (command->payload).bufferSize;
          pngrep._8_8_ = (command->payload).heap;
          route_1.rid = (command->dest_id).gid;
          searchValue1_00._M_str = (char *)pngrep._8_8_;
          searchValue1_00._M_len = pngrep._0_8_;
          gmlc::containers::
          DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
          ::insert<std::basic_string_view<char,std::char_traits<char>>>
                    ((DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
                      *)this_02,searchValue1_00,(GlobalBrokerId *)&route_1,
                     (basic_string_view<char,_std::char_traits<char>_> *)&pngrep);
          rVar15 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
          pBVar19 = (this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pBVar19[-1].route.rid = rVar15.rid;
          pBVar19[-1].global_id.gid = (command->dest_id).gid;
          std::
          _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<helics::GlobalBrokerId&,helics::route_id&>
                    ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->routing_table,&(_Var18._M_current)->global_id,&pBVar19[-1].route);
          return;
        }
        iVar7 = (command->dest_id).gid;
        if (((_Var18._M_current)->global_id).gid == iVar7) {
          message_00._M_str = "repeated broker acks";
          message_00._M_len = 0x14;
          name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
          BrokerBase::sendToLogger
                    (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3
                     ,name_00,message_00,false);
          return;
        }
        ((_Var18._M_current)->global_id).gid = iVar7;
        pngrep.messageAction = ((_Var18._M_current)->route).rid;
        route_1.rid = (command->dest_id).gid;
        existingValue_00._M_str = ((_Var18._M_current)->name)._M_dataplus._M_p;
        existingValue_00._M_len = ((_Var18._M_current)->name)._M_string_length;
        gmlc::containers::
        DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
        ::addSearchTerm(this_02,(GlobalBrokerId *)&route_1,existingValue_00);
        std::
        _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<helics::GlobalBrokerId&,helics::route_id&>
                  ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->routing_table,&(_Var18._M_current)->global_id,&pngrep);
        (command->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,pngrep._0_8_ & 0xffffffff,command);
        return;
      }
      if ((command->flags & 0x10) != 0) {
        GVar2.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar8 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar9 = (this->super_BrokerBase).identifier._M_string_length;
        _route_1 = (pointer)(command->payload).heap;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x1c;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&route_1;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&pngrep,(v11 *)"unable to register broker {}",fmt_00,args_00);
        message_01._M_str = (char *)pngrep._0_8_;
        message_01._M_len._0_4_ = pngrep.source_id.gid;
        message_01._M_len._4_4_ = pngrep.source_handle.hid;
        name_01._M_str = pcVar8;
        name_01._M_len = sVar9;
        BrokerBase::sendToLogger(this_00,GVar2,0,name_01,message_01,false);
        std::__cxx11::string::~string((string *)&pngrep);
        return;
      }
      BVar4 = (command->dest_id).gid;
      (this->super_BrokerBase).global_broker_id_local.gid = BVar4;
      LOCK();
      (this->super_BrokerBase).global_id._M_i.gid = BVar4;
      UNLOCK();
      (this->super_BrokerBase).higher_broker_id.gid = (command->source_id).gid;
      uVar1 = command->flags;
      if (((uVar1 & 0x20) != 0) && ((this->super_BrokerBase).globalTime = true, (char)uVar1 < '\0'))
      {
        (this->super_BrokerBase).asyncTime = true;
      }
      (((this->super_BrokerBase).timeCoord._M_t.
        super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
        .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->mSourceId).gid =
           BVar4;
      transmitDelayedMessages(this);
      BVar5 = (this->super_BrokerBase).global_broker_id_local.gid;
      pBVar11 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pBVar19 = (this->mBrokers).dataStorage.
                     super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start; pBVar19 != pBVar11;
          pBVar19 = pBVar19 + 1) {
        if (pBVar19->_nonLocal == false) {
          (pBVar19->parent).gid = BVar5;
        }
      }
      this_03 = (this->timeoutMon)._M_t.
                super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
                .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl;
      (this_03->parentConnection).connection.gid = (this->super_BrokerBase).higher_broker_id.gid;
      if ((command->flags & 0x4000) != 0) {
        (this_03->parentConnection).disablePing = true;
        (this_03->parentConnection).waitingForPingReply = false;
      }
      TimeoutMonitor::reset(this_03);
      if ((command->flags & 0x800) == 0) {
        return;
      }
      (this->super_BrokerBase).globalDisconnect = true;
      return;
    }
  }
  processQueryCommand(this,command);
  return;
}

Assistant:

void CoreBroker::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            } else {
                routeMessage(command);
            }
            break;
        case CMD_BROKER_SETUP: {
            global_broker_id_local = global_id.load();
            isRootc = _isRoot.load();
            timeCoord->setSourceId(global_broker_id_local);
            connectionEstablished = true;
            if (!earlyMessages.empty()) {
                for (auto& message : earlyMessages) {
                    if (isPriorityCommand(message)) {
                        processPriorityCommand(std::move(message));
                    } else {
                        processCommand(std::move(message));
                    }
                }
                earlyMessages.clear();
            }
            break;
        }
        case CMD_REG_FED:
            fedRegistration(std::move(command));
            break;
        case CMD_REG_BROKER:
            brokerRegistration(std::move(command));
            break;
        case CMD_FED_ACK: {  // we can't be root if we got one of these
            auto fed = mFederates.find(command.name());
            if (fed != mFederates.end()) {
                auto route = fed->route;
                if (!fed->global_id.isValid()) {
                    fed->global_id = command.dest_id;
                    mFederates.addSearchTerm(command.dest_id, fed->name);
                }
                transmit(route, command);
                routing_table.emplace(fed->global_id, route);
                if (enable_profiling) {
                    ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                                     global_broker_id_local,
                                                     command.dest_id);
                    setActionFlag(fedEnableProfiling, indicator_flag);
                    transmit(route, fedEnableProfiling);
                }
            } else {
                // this means we haven't seen this federate before for some reason
                mFederates.insert(command.name(), command.dest_id, command.name());
                mFederates.back().route = getRoute(command.source_id);
                mFederates.back().global_id = command.dest_id;
                routing_table.emplace(fed->global_id, mFederates.back().route);
                // it also means we don't forward it
            }

        } break;
        case CMD_BROKER_ACK: {  // we can't be root if we got one of these
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    // generate an error message
                    LOG_ERROR(global_broker_id_local,
                              identifier,
                              fmt::format("unable to register broker {}",
                                          command.payload.to_string()));
                    return;
                }

                global_broker_id_local = command.dest_id;
                global_id.store(global_broker_id_local);
                higher_broker_id = command.source_id;
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                timeCoord->setSourceId(global_broker_id_local);
                transmitDelayedMessages();
                mBrokers.apply([localid = global_broker_id_local](auto& brk) {
                    if (!brk._nonLocal) {
                        brk.parent = localid;
                    }
                });

                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                timeoutMon->reset();
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                return;
            }
            auto broker = mBrokers.find(command.name());
            if (broker != mBrokers.end()) {
                if (broker->global_id == GlobalBrokerId{command.dest_id}) {
                    // drop the packet since we have seen this ack already
                    LOG_WARNING(global_broker_id_local, identifier, "repeated broker acks");
                    return;
                }
                broker->global_id = GlobalBrokerId{command.dest_id};
                auto route = broker->route;
                mBrokers.addSearchTerm(GlobalBrokerId{command.dest_id}, broker->name);
                routing_table.emplace(broker->global_id, route);
                command.source_id = global_broker_id_local;  // we want the intermediate broker to
                                                             // change the source_id
                transmit(route, command);
            } else {
                mBrokers.insert(command.name(), GlobalBrokerId{command.dest_id}, command.name());
                mBrokers.back().route = getRoute(command.source_id);
                mBrokers.back().global_id = GlobalBrokerId{command.dest_id};
                routing_table.emplace(broker->global_id, mBrokers.back().route);
            }
        } break;
        case CMD_PRIORITY_DISCONNECT: {
            auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
            if (brk != nullptr) {
                brk->state = ConnectionState::DISCONNECTED;
            }
            if (getAllConnectionState() >= ConnectionState::DISCONNECTED) {
                if (!isRootc) {
                    ActionMessage dis(CMD_PRIORITY_DISCONNECT);
                    dis.source_id = global_broker_id_local;
                    transmit(parent_route_id, dis);
                }
                addActionMessage(CMD_STOP);
            }
        } break;
        case CMD_REG_ROUTE:
            break;
        case CMD_SEND_COMMAND:
            processCommandInstruction(command);
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
        case CMD_SET_GLOBAL:
            processQueryCommand(command);
            break;

        default:
            // must not have been a priority command
            break;
    }
}